

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_VerilogSimpleWrite(Acb_Ntk_t *p,char *pFileName)

{
  bool bVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  int local_40;
  int start;
  int k;
  int iFanin;
  int *pFanin;
  FILE *pFile;
  int local_20;
  int fFirst;
  int iObj;
  int i;
  char *pFileName_local;
  Acb_Ntk_t *p_local;
  
  bVar1 = true;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    pcVar5 = Acb_NtkName(p);
    fprintf(__stream,"\nmodule %s (\n  ",pcVar5);
    for (fFirst = 0; iVar2 = Acb_NtkPiNum(p), fFirst < iVar2; fFirst = fFirst + 1) {
      iVar2 = Acb_NtkCi(p,fFirst);
      pcVar5 = Acb_ObjNameStr(p,iVar2);
      fprintf(__stream,"%s, ",pcVar5);
    }
    fprintf(__stream,"\n  ");
    for (fFirst = 0; iVar2 = Acb_NtkPoNum(p), fFirst < iVar2; fFirst = fFirst + 1) {
      iVar2 = Acb_NtkCo(p,fFirst);
      pcVar5 = ", ";
      if (bVar1) {
        pcVar5 = "";
      }
      pcVar6 = Acb_ObjNameStr(p,iVar2);
      fprintf(__stream,"%s%s",pcVar5,pcVar6);
      bVar1 = false;
    }
    fprintf(__stream,"\n);\n\n");
    for (fFirst = 0; iVar2 = Acb_NtkPiNum(p), fFirst < iVar2; fFirst = fFirst + 1) {
      iVar2 = Acb_NtkCi(p,fFirst);
      pcVar5 = Acb_ObjNameStr(p,iVar2);
      fprintf(__stream,"  input %s;\n",pcVar5);
    }
    fprintf(__stream,"\n");
    for (fFirst = 0; iVar2 = Acb_NtkPoNum(p), fFirst < iVar2; fFirst = fFirst + 1) {
      iVar2 = Acb_NtkCo(p,fFirst);
      pcVar5 = Acb_ObjNameStr(p,iVar2);
      fprintf(__stream,"  output %s;\n",pcVar5);
    }
    fprintf(__stream,"\n");
    for (local_20 = 1; iVar2 = Vec_StrSize(&p->vObjType), local_20 < iVar2; local_20 = local_20 + 1)
    {
      AVar3 = Acb_ObjType(p,local_20);
      if (((AVar3 != ABC_OPER_NONE) && (iVar2 = Acb_ObjIsCio(p,local_20), iVar2 == 0)) &&
         (iVar2 = Acb_ObjFaninNum(p,local_20), 0 < iVar2)) {
        pcVar5 = Acb_ObjNameStr(p,local_20);
        fprintf(__stream,"  wire %s;\n",pcVar5);
      }
    }
    fprintf(__stream,"\n");
    for (local_20 = 1; iVar2 = Vec_StrSize(&p->vObjType), local_20 < iVar2; local_20 = local_20 + 1)
    {
      AVar3 = Acb_ObjType(p,local_20);
      if ((AVar3 != ABC_OPER_NONE) && (iVar2 = Acb_ObjIsCio(p,local_20), iVar2 == 0)) {
        iVar2 = Acb_ObjFaninNum(p,local_20);
        if (iVar2 < 1) {
          AVar3 = Acb_ObjType(p,local_20);
          if ((AVar3 != ABC_OPER_CONST_F) &&
             (AVar3 = Acb_ObjType(p,local_20), AVar3 != ABC_OPER_CONST_T)) {
            __assert_fail("Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                          ,0x1cc,"void Acb_VerilogSimpleWrite(Acb_Ntk_t *, char *)");
          }
          pcVar5 = Acb_Oper2Name(0xb);
          fprintf(__stream,"  %s (",pcVar5);
          AVar3 = Acb_ObjType(p,local_20);
          if (AVar3 == ABC_OPER_CONST_X) {
            fprintf(__stream," 1\'bx");
          }
          else {
            AVar3 = Acb_ObjType(p,local_20);
            fprintf(__stream," 1\'b%d",(ulong)(AVar3 == ABC_OPER_CONST_T));
          }
          fprintf(__stream," );\n");
        }
        else {
          lVar7 = ftell(__stream);
          AVar3 = Acb_ObjType(p,local_20);
          pcVar5 = Acb_Oper2Name(AVar3);
          fprintf(__stream,"  %s (",pcVar5);
          pcVar5 = Acb_ObjNameStr(p,local_20);
          fprintf(__stream," %s",pcVar5);
          local_40 = 0;
          piVar8 = Acb_ObjFanins(p,local_20);
          for (; local_40 < *piVar8; local_40 = local_40 + 1) {
            pcVar5 = Acb_ObjNameStr(p,piVar8[local_40 + 1]);
            fprintf(__stream,", %s",pcVar5);
          }
          fprintf(__stream," );");
          iVar2 = Acb_NtkHasObjWeights(p);
          if ((iVar2 != 0) && (iVar2 = Acb_ObjWeight(p,local_20), 0 < iVar2)) {
            lVar9 = ftell(__stream);
            uVar4 = Acb_ObjWeight(p,local_20);
            fprintf(__stream," %*s // weight = %d",(ulong)(uint)(((int)lVar7 + 0x37) - (int)lVar9),
                    "",(ulong)uVar4);
          }
          fprintf(__stream,"\n");
        }
      }
    }
    fprintf(__stream,"\nendmodule\n\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Acb_VerilogSimpleWrite( Acb_Ntk_t * p, char * pFileName )
{
    int i, iObj, fFirst = 1;
    FILE * pFile = fopen( pFileName, "wb" ); 
    if ( pFile == NULL ) { printf( "Cannot open file \"%s\" for writing.\n", pFileName ); return; }

    fprintf( pFile, "\nmodule %s (\n  ", Acb_NtkName(p) );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "%s, ", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n  " );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "%s%s", fFirst ? "":", ", Acb_ObjNameStr(p, iObj) ), fFirst = 0;
    fprintf( pFile, "\n);\n\n" );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "  input %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "  output %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
            fprintf( pFile, "  wire %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
        {
            int * pFanin, iFanin, k, start = ftell(pFile)+55;
            fprintf( pFile, "  %s (", Acb_Oper2Name( Acb_ObjType(p, iObj) ) );
            fprintf( pFile, " %s", Acb_ObjNameStr(p, iObj) );
            Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
                //if ( iFanin == 0 ) fprintf( pFile, ", <zero>" ); else
                fprintf( pFile, ", %s", Acb_ObjNameStr(p, iFanin) );
            fprintf( pFile, " );" );
            if ( Acb_NtkHasObjWeights(p) && Acb_ObjWeight(p, iObj) > 0 )
                fprintf( pFile, " %*s // weight = %d", (int)(start-ftell(pFile)), "", Acb_ObjWeight(p, iObj) );
            fprintf( pFile, "\n" );
        }
        else // constant nodes
        {
            assert( Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            if ( Acb_ObjType(p, iObj) == ABC_OPER_CONST_X )
                fprintf( pFile, " 1\'bx" );
            else
                fprintf( pFile, " 1\'b%d", Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, " );\n" );
        }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );
}